

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS
ref_geom_add_between
          (REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_DBL node1_weight,REF_INT new_node)

{
  REF_INT RVar1;
  REF_GEOM ref_geom_00;
  REF_NODE ref_node_00;
  REF_CELL pRVar2;
  uint uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double local_2c0;
  double local_2b8;
  double local_2a8;
  double local_298;
  double local_290;
  double local_280;
  double local_278;
  double local_268;
  double local_260;
  double local_258;
  REF_STATUS ref_private_macro_code_rss_20;
  REF_STATUS ref_private_macro_code_rss_19;
  REF_DBL t;
  REF_INT edgeid;
  REF_INT faceid;
  REF_STATUS ref_private_macro_code_rss_18;
  REF_STATUS ref_private_macro_code_rss_17;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_LONG ref_private_status_reib_bi;
  REF_LONG ref_private_status_reib_ai;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_INT ii;
  REF_DBL mid_weight;
  REF_DBL mid_t;
  REF_DBL actual_weight;
  REF_DBL total;
  REF_DBL d1;
  REF_DBL d0;
  REF_DBL dx1 [3];
  double local_198;
  REF_DBL dx0 [3];
  REF_DBL local_178;
  REF_DBL xyz [3];
  REF_STATUS ref_private_macro_code_rsb;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL node0_weight;
  REF_BOOL support1;
  REF_BOOL support0;
  REF_INT geom1;
  REF_INT geom0;
  REF_INT face_geom;
  REF_INT cells [2];
  REF_INT ncell;
  REF_INT i;
  REF_STATUS status;
  REF_INT nodes [27];
  REF_INT cell;
  REF_INT sense;
  REF_INT edge_geom;
  REF_BOOL supported;
  REF_BOOL has_edge_support;
  REF_DBL param1 [2];
  REF_DBL param0 [2];
  REF_DBL param [2];
  REF_INT id;
  REF_INT type;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_GEOM ref_geom;
  REF_INT new_node_local;
  REF_DBL node1_weight_local;
  REF_INT node1_local;
  REF_INT node0_local;
  REF_GRID ref_grid_local;
  
  ref_geom_00 = ref_grid->geom;
  ref_node_00 = ref_grid->node;
  dVar4 = 1.0 - node1_weight;
  uVar3 = ref_geom_supported(ref_geom_00,node0,(REF_BOOL *)((long)&node0_weight + 4));
  if (uVar3 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x4aa,
           "ref_geom_add_between",(ulong)uVar3,"node0 supported");
    return uVar3;
  }
  uVar3 = ref_geom_supported(ref_geom_00,node1,(REF_BOOL *)&node0_weight);
  if (uVar3 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x4ab,
           "ref_geom_add_between",(ulong)uVar3,"node1 supported");
    return uVar3;
  }
  if ((node0_weight._4_4_ == 0) || (node0_weight._0_4_ == 0)) {
    return 0;
  }
  pRVar2 = ref_grid->cell[0];
  i = node0;
  status = node1;
  uVar3 = ref_cell_with(pRVar2,&i,nodes + 0x19);
  if (uVar3 == 5) {
    edge_geom = 0;
    cell = -1;
    goto LAB_00188fce;
  }
  if (uVar3 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x4b9,
           "ref_geom_add_between",(ulong)uVar3,"search for edg");
    return uVar3;
  }
  uVar3 = ref_cell_nodes(pRVar2,nodes[0x19],&i);
  if (uVar3 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x4ba,
           "ref_geom_add_between",(ulong)uVar3,"get id");
    return uVar3;
  }
  RVar1 = (&i)[pRVar2->node_per];
  uVar3 = ref_geom_cell_tuv(ref_geom_00,node0,&i,1,param1 + 1,nodes + 0x1a);
  if (uVar3 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x4be,
           "ref_geom_add_between",(ulong)uVar3,"cell uv");
    return uVar3;
  }
  uVar3 = ref_geom_cell_tuv(ref_geom_00,node1,&i,1,(REF_DBL *)&supported,nodes + 0x1a);
  if (uVar3 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x4c0,
           "ref_geom_add_between",(ulong)uVar3,"cell uv");
    return uVar3;
  }
  param0[1] = dVar4 * param1[1] + node1_weight * _supported;
  if ((ref_geom_00->model != (void *)0x0) &&
     (uVar3 = ref_egads_inverse_eval
                        (ref_geom_00,1,RVar1,ref_node_00->real + new_node * 0xf,param0 + 1),
     uVar3 != 0)) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x4c5,
           "ref_geom_add_between",(ulong)uVar3,"inv eval edge");
    ref_geom_tec(ref_grid,"ref_geom_split_edge.tec");
    return uVar3;
  }
  if (_supported <= param1[1]) {
    local_258 = _supported;
  }
  else {
    local_258 = param1[1];
  }
  if (param0[1] < local_258) {
LAB_0018874f:
    param0[1] = dVar4 * param1[1] + node1_weight * _supported;
  }
  else {
    if (param1[1] <= _supported) {
      local_260 = _supported;
    }
    else {
      local_260 = param1[1];
    }
    if (local_260 < param0[1]) goto LAB_0018874f;
  }
  if (ref_geom_00->model != (void *)0x0) {
    uVar3 = ref_egads_eval_at(ref_geom_00,1,RVar1,param0 + 1,&local_178,(REF_DBL *)0x0);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x4cf,
             "ref_geom_add_between",(ulong)uVar3,"eval");
      return uVar3;
    }
    for (ref_private_macro_code_rss_7 = 0; ref_private_macro_code_rss_7 < 3;
        ref_private_macro_code_rss_7 = ref_private_macro_code_rss_7 + 1) {
      dx0[(long)ref_private_macro_code_rss_7 + -1] =
           ref_node_00->real[ref_private_macro_code_rss_7 + node0 * 0xf] -
           xyz[(long)ref_private_macro_code_rss_7 + -1];
    }
    for (ref_private_macro_code_rss_7 = 0; ref_private_macro_code_rss_7 < 3;
        ref_private_macro_code_rss_7 = ref_private_macro_code_rss_7 + 1) {
      dx1[(long)ref_private_macro_code_rss_7 + -1] =
           ref_node_00->real[ref_private_macro_code_rss_7 + node1 * 0xf] -
           xyz[(long)ref_private_macro_code_rss_7 + -1];
    }
    d1 = sqrt(dx0[1] * dx0[1] + local_198 * local_198 + dx0[0] * dx0[0]);
    total = sqrt(dx1[1] * dx1[1] + d0 * d0 + dx1[0] * dx1[0]);
    actual_weight = d1 + total;
    mid_t = -1.0;
    if (actual_weight * 1e+20 <= 0.0) {
      local_268 = -(actual_weight * 1e+20);
    }
    else {
      local_268 = actual_weight * 1e+20;
    }
    if (d1 <= 0.0) {
      local_278 = -d1;
    }
    else {
      local_278 = d1;
    }
    if (local_278 < local_268) {
      mid_t = d1 / actual_weight;
    }
    mid_weight = dVar4 * param1[1] + node1_weight * _supported;
    uVar3 = ref_egads_eval_at(ref_geom_00,1,RVar1,&mid_weight,&local_178,(REF_DBL *)0x0);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x4dd,
             "ref_geom_add_between",(ulong)uVar3,"eval");
      return uVar3;
    }
    for (ref_private_macro_code_rss_7 = 0; ref_private_macro_code_rss_7 < 3;
        ref_private_macro_code_rss_7 = ref_private_macro_code_rss_7 + 1) {
      dx0[(long)ref_private_macro_code_rss_7 + -1] =
           ref_node_00->real[ref_private_macro_code_rss_7 + node0 * 0xf] -
           xyz[(long)ref_private_macro_code_rss_7 + -1];
    }
    for (ref_private_macro_code_rss_7 = 0; ref_private_macro_code_rss_7 < 3;
        ref_private_macro_code_rss_7 = ref_private_macro_code_rss_7 + 1) {
      dx1[(long)ref_private_macro_code_rss_7 + -1] =
           ref_node_00->real[ref_private_macro_code_rss_7 + node1 * 0xf] -
           xyz[(long)ref_private_macro_code_rss_7 + -1];
    }
    d1 = sqrt(dx0[1] * dx0[1] + local_198 * local_198 + dx0[0] * dx0[0]);
    total = sqrt(dx1[1] * dx1[1] + d0 * d0 + dx1[0] * dx1[0]);
    actual_weight = d1 + total;
    _ref_private_macro_code_rss_6 = -1.0;
    if (actual_weight * 1e+20 <= 0.0) {
      local_280 = -(actual_weight * 1e+20);
    }
    else {
      local_280 = actual_weight * 1e+20;
    }
    if (d1 <= 0.0) {
      local_290 = -d1;
    }
    else {
      local_290 = d1;
    }
    if (local_290 < local_280) {
      _ref_private_macro_code_rss_6 = d1 / actual_weight;
    }
    if (_ref_private_macro_code_rss_6 - node1_weight <= 0.0) {
      local_298 = -(_ref_private_macro_code_rss_6 - node1_weight);
    }
    else {
      local_298 = _ref_private_macro_code_rss_6 - node1_weight;
    }
    if (mid_t - node1_weight <= 0.0) {
      local_2a8 = -(mid_t - node1_weight);
    }
    else {
      local_2a8 = mid_t - node1_weight;
    }
    if (local_298 < local_2a8) {
      param0[1] = mid_weight;
    }
  }
  if (_supported <= param1[1]) {
    local_2b8 = _supported;
  }
  else {
    local_2b8 = param1[1];
  }
  if (param0[1] < local_2b8) {
LAB_00188ed5:
    param0[1] = dVar4 * param1[1] + node1_weight * _supported;
  }
  else {
    if (param1[1] <= _supported) {
      local_2c0 = _supported;
    }
    else {
      local_2c0 = param1[1];
    }
    if (local_2c0 < param0[1]) goto LAB_00188ed5;
  }
  uVar3 = ref_geom_add(ref_geom_00,new_node,1,RVar1,param0 + 1);
  if (uVar3 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x4f2,
           "ref_geom_add_between",(ulong)uVar3,"new geom");
    return uVar3;
  }
  edge_geom = 1;
  uVar3 = ref_geom_find(ref_geom_00,new_node,1,RVar1,&cell);
  if (uVar3 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x4f5,
           "ref_geom_add_between",(ulong)uVar3,"find the new edge for later face uv evaluation");
    return uVar3;
  }
LAB_00188fce:
  pRVar2 = ref_grid->cell[3];
  ref_grid_local._4_4_ = ref_cell_list_with2(pRVar2,node0,node1,2,cells,&geom0);
  if (ref_grid_local._4_4_ == 0) {
    if (cells[0] == 0) {
      ref_grid_local._4_4_ = 0;
    }
    else if ((ref_geom_00->manifold == 0) || ((long)cells[0] == 2)) {
      for (cells[1] = 0; cells[1] < cells[0]; cells[1] = cells[1] + 1) {
        nodes[0x19] = (&geom0)[cells[1]];
        uVar3 = ref_cell_nodes(pRVar2,nodes[0x19],&i);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x508,"ref_geom_add_between",(ulong)uVar3,"get id");
          return uVar3;
        }
        uVar3 = ref_geom_tri_supported(ref_geom_00,&i,&sense);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x50a,"ref_geom_add_between",(ulong)uVar3,"tri support");
          return uVar3;
        }
        if (sense != 0) {
          RVar1 = (&i)[pRVar2->node_per];
          uVar3 = ref_geom_cell_tuv(ref_geom_00,node0,&i,2,param1 + 1,nodes + 0x1a);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x510,"ref_geom_add_between",(ulong)uVar3,"cell uv");
            return uVar3;
          }
          uVar3 = ref_geom_cell_tuv(ref_geom_00,node1,&i,2,(REF_DBL *)&supported,nodes + 0x1a);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x512,"ref_geom_add_between",(ulong)uVar3,"cell uv");
            return uVar3;
          }
          param0[1] = dVar4 * param1[1] + node1_weight * _supported;
          dVar6 = node1_weight * param1[0];
          dVar5 = dVar4 * param0[0];
          uVar3 = ref_geom_add(ref_geom_00,new_node,2,RVar1,param0 + 1);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x516,"ref_geom_add_between",(ulong)uVar3,"new geom");
            return uVar3;
          }
          uVar3 = ref_geom_find(ref_geom_00,new_node,2,RVar1,&geom1);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x518,"ref_geom_add_between",(ulong)uVar3,"new face geom");
            return uVar3;
          }
          uVar3 = ref_geom_find(ref_geom_00,node0,2,RVar1,&support0);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x51a,"ref_geom_add_between",(ulong)uVar3,"face geom");
            return uVar3;
          }
          uVar3 = ref_geom_find(ref_geom_00,node1,2,RVar1,&support1);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x51b,"ref_geom_add_between",(ulong)uVar3,"face geom");
            return uVar3;
          }
          if (((ref_geom_00->descr[support0 * 6 + 3] != 0) &&
              (ref_geom_00->descr[support1 * 6 + 3] != 0)) &&
             (ref_geom_00->descr[support0 * 6 + 3] == ref_geom_00->descr[support1 * 6 + 3])) {
            ref_geom_00->descr[geom1 * 6 + 3] = ref_geom_00->descr[support0 * 6 + 3];
          }
          if ((ref_geom_00->model != (void *)0x0) && (edge_geom != 0)) {
            nodes[0x1a] = (REF_INT)(ref_geom_00->descr[geom1 * 6 + 3] != 0);
            uVar3 = ref_egads_edge_face_uv
                              (ref_geom_00,ref_geom_00->descr[cell * 6 + 1],
                               ref_geom_00->descr[geom1 * 6 + 1],nodes[0x1a],
                               ref_geom_00->param[cell << 1],param0 + 1);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0x52c,"ref_geom_add_between",(ulong)uVar3,"edge t param");
              return uVar3;
            }
            ref_geom_00->param[geom1 << 1] = param0[1];
            ref_geom_00->param[geom1 * 2 + 1] = dVar5 + dVar6;
          }
        }
      }
      if (((ref_geom_00->model == (void *)0x0) || (edge_geom != 0)) ||
         (ref_grid_local._4_4_ =
               ref_geom_add_between_face_interior(ref_grid,node0,node1,node1_weight,new_node),
         ref_grid_local._4_4_ == 0)) {
        ref_grid_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x535,"ref_geom_add_between",(ulong)ref_grid_local._4_4_,"position new node in uv");
      }
    }
    else {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x504,
             "ref_geom_add_between","expected two tri for between",2,(long)cells[0]);
      ref_geom_tattle(ref_geom_00,node0);
      ref_geom_tattle(ref_geom_00,node1);
      ref_node_location(ref_node_00,node0);
      ref_node_location(ref_node_00,node1);
      ref_grid_local._4_4_ = 1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x4fa,
           "ref_geom_add_between",(ulong)ref_grid_local._4_4_,"list");
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_geom_add_between(REF_GRID ref_grid, REF_INT node0,
                                        REF_INT node1, REF_DBL node1_weight,
                                        REF_INT new_node) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT type, id;
  REF_DBL param[2], param0[2], param1[2];
  REF_BOOL has_edge_support, supported;
  REF_INT edge_geom;
  REF_INT sense, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_STATUS status;
  REF_INT i, ncell, cells[2];
  REF_INT face_geom, geom0, geom1;
  REF_BOOL support0, support1;
  REF_DBL node0_weight = 1.0 - node1_weight;

  RSS(ref_geom_supported(ref_geom, node0, &support0), "node0 supported");
  RSS(ref_geom_supported(ref_geom, node1, &support1), "node1 supported");
  if (!support0 || !support1) {
    return REF_SUCCESS;
  }

  /* insert edge geom on edge cell if present */
  nodes[0] = node0;
  nodes[1] = node1;
  ref_cell = ref_grid_edg(ref_grid);
  status = ref_cell_with(ref_cell, nodes, &cell);
  if (REF_NOT_FOUND == status) {
    has_edge_support = REF_FALSE;
    edge_geom = REF_EMPTY;
  } else {
    RSS(status, "search for edg");
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "get id");
    id = nodes[ref_cell_node_per(ref_cell)];
    type = REF_GEOM_EDGE;
    RSS(ref_geom_cell_tuv(ref_geom, node0, nodes, type, param0, &sense),
        "cell uv");
    RSS(ref_geom_cell_tuv(ref_geom, node1, nodes, type, param1, &sense),
        "cell uv");
    param[0] = node0_weight * param0[0] + node1_weight * param1[0];
    if (ref_geom_model_loaded(ref_geom))
      RSB(ref_egads_inverse_eval(ref_geom, type, id,
                                 ref_node_xyz_ptr(ref_node, new_node), param),
          "inv eval edge", ref_geom_tec(ref_grid, "ref_geom_split_edge.tec"));
    /* enforce bounding box and use midpoint as full-back */
    if (param[0] < MIN(param0[0], param1[0]) ||
        MAX(param0[0], param1[0]) < param[0])
      param[0] = node0_weight * param0[0] + node1_weight * param1[0];
    if (ref_geom_model_loaded(ref_geom)) { /* check weight and distance ratio */
      REF_DBL xyz[3], dx0[3], dx1[3], d0, d1, total, actual_weight;
      REF_DBL mid_t, mid_weight;
      REF_INT ii;
      RSS(ref_egads_eval_at(ref_geom, REF_GEOM_EDGE, id, param, xyz, NULL),
          "eval");
      for (ii = 0; ii < 3; ii++)
        dx0[ii] = ref_node_xyz(ref_node, ii, node0) - xyz[ii];
      for (ii = 0; ii < 3; ii++)
        dx1[ii] = ref_node_xyz(ref_node, ii, node1) - xyz[ii];
      d0 = sqrt(ref_math_dot(dx0, dx0));
      d1 = sqrt(ref_math_dot(dx1, dx1));
      total = d0 + d1;
      actual_weight = -1.0;
      if (ref_math_divisible(d0, total)) {
        actual_weight = d0 / total;
      }
      mid_t = node0_weight * param0[0] + node1_weight * param1[0];
      RSS(ref_egads_eval_at(ref_geom, REF_GEOM_EDGE, id, &mid_t, xyz, NULL),
          "eval");
      for (ii = 0; ii < 3; ii++)
        dx0[ii] = ref_node_xyz(ref_node, ii, node0) - xyz[ii];
      for (ii = 0; ii < 3; ii++)
        dx1[ii] = ref_node_xyz(ref_node, ii, node1) - xyz[ii];
      d0 = sqrt(ref_math_dot(dx0, dx0));
      d1 = sqrt(ref_math_dot(dx1, dx1));
      total = d0 + d1;
      mid_weight = -1.0;
      if (ref_math_divisible(d0, total)) {
        mid_weight = d0 / total;
      }
      if (ABS(mid_weight - node1_weight) < ABS(actual_weight - node1_weight)) {
        /* printf("request %f actual %f mid %f\n",
                  node1_weight,actual_weight,mid_weight); */
        param[0] = mid_t;
      }
    }
    if (param[0] < MIN(param0[0], param1[0]) ||
        MAX(param0[0], param1[0]) < param[0])
      param[0] = node0_weight * param0[0] + node1_weight * param1[0];
    RSS(ref_geom_add(ref_geom, new_node, type, id, param), "new geom");
    has_edge_support = REF_TRUE;
    RSS(ref_geom_find(ref_geom, new_node, type, id, &edge_geom),
        "find the new edge for later face uv evaluation");
  }

  /* insert face between */
  ref_cell = ref_grid_tri(ref_grid);
  RSS(ref_cell_list_with2(ref_cell, node0, node1, 2, &ncell, cells), "list");
  if (0 == ncell) { /* volume edge */
    return REF_SUCCESS;
  }
  if (ref_geom_manifold(ref_geom)) {
    REIB(2, ncell, "expected two tri for between", {
      ref_geom_tattle(ref_geom, node0);
      ref_geom_tattle(ref_geom, node1);
      ref_node_location(ref_node, node0);
      ref_node_location(ref_node, node1);
    });
  }
  for (i = 0; i < ncell; i++) {
    cell = cells[i];
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "get id");

    RSS(ref_geom_tri_supported(ref_geom, nodes, &supported), "tri support");
    if (!supported) continue; /* no geom support, skip */

    id = nodes[ref_cell_node_per(ref_cell)];
    type = REF_GEOM_FACE;
    RSS(ref_geom_cell_tuv(ref_geom, node0, nodes, type, param0, &sense),
        "cell uv");
    RSS(ref_geom_cell_tuv(ref_geom, node1, nodes, type, param1, &sense),
        "cell uv");
    param[0] = node0_weight * param0[0] + node1_weight * param1[0];
    param[1] = node0_weight * param0[1] + node1_weight * param1[1];

    RSS(ref_geom_add(ref_geom, new_node, type, id, param), "new geom");
    RSS(ref_geom_find(ref_geom, new_node, type, id, &face_geom),
        "new face geom");

    RSS(ref_geom_find(ref_geom, node0, type, id, &geom0), "face geom");
    RSS(ref_geom_find(ref_geom, node1, type, id, &geom1), "face geom");
    if (0 != ref_geom_jump(ref_geom, geom0) &&
        0 != ref_geom_jump(ref_geom, geom1) &&
        ref_geom_jump(ref_geom, geom0) == ref_geom_jump(ref_geom, geom1)) {
      ref_geom_jump(ref_geom, face_geom) = ref_geom_jump(ref_geom, geom0);
    }

    /* if there is an edge between, set the face uv based on edge t */
    if (ref_geom_model_loaded(ref_geom) && has_edge_support) {
      REF_INT faceid, edgeid;
      REF_DBL t;
      edgeid = ref_geom_id(ref_geom, edge_geom);
      faceid = ref_geom_id(ref_geom, face_geom);
      t = ref_geom_param(ref_geom, 0, edge_geom);
      sense = 0;
      if (0 != ref_geom_jump(ref_geom, face_geom)) sense = 1;
      RSS(ref_egads_edge_face_uv(ref_geom, edgeid, faceid, sense, t, param),
          "edge t param");
      ref_geom_param(ref_geom, 0, face_geom) = param[0];
      ref_geom_param(ref_geom, 1, face_geom) = param[1];
    }
  }

  if (ref_geom_model_loaded(ref_geom) && !has_edge_support) {
    RSS(ref_geom_add_between_face_interior(ref_grid, node0, node1, node1_weight,
                                           new_node),
        "position new node in uv");
  }

  return REF_SUCCESS;
}